

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Headers.cpp
# Opt level: O1

void __thiscall KDReports::Test::testNoHeaders(Test *this)

{
  char cVar1;
  void *pvVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  bool bVar6;
  Report report;
  long local_28;
  
  KDReports::Report::Report(&report,(QObject *)0x0);
  if (*(long *)(local_28 + 0x78) == 0) {
    bVar6 = true;
  }
  else {
    bVar6 = *(long *)(*(long *)(local_28 + 0x78) + 0x30) == 0;
  }
  cVar1 = QTest::qVerify(bVar6,"headers.isEmpty()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                         ,0x1f);
  if (cVar1 != '\0') {
    iVar5 = (int)local_28 + 0x78;
    pvVar2 = (void *)KDReports::HeaderMap::headerForPage(iVar5,1);
    pcVar3 = (char *)QTest::toString(pvVar2);
    pcVar4 = (char *)QTest::toString((void *)0x0);
    cVar1 = QTest::compare_helper
                      (pvVar2 == (void *)0x0,"Compared pointers are not the same",pcVar3,pcVar4,
                       "headers.headerForPage(1, 2)","( Header * )nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                       ,0x20);
    if (cVar1 != '\0') {
      pvVar2 = (void *)KDReports::HeaderMap::headerForPage(iVar5,2);
      pcVar3 = (char *)QTest::toString(pvVar2);
      pcVar4 = (char *)QTest::toString((void *)0x0);
      QTest::compare_helper
                (pvVar2 == (void *)0x0,"Compared pointers are not the same",pcVar3,pcVar4,
                 "headers.headerForPage(2, 2)","( Header * )nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/Headers/Headers.cpp"
                 ,0x21);
    }
  }
  KDReports::Report::~Report(&report);
  return;
}

Assistant:

void testNoHeaders()
    {
        Report report;
        HeaderMap &headers = report.d->m_headers;
        QVERIFY(headers.isEmpty());
        QCOMPARE(headers.headerForPage(1, 2), ( Header * )nullptr);
        QCOMPARE(headers.headerForPage(2, 2), ( Header * )nullptr);
    }